

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O1

void __thiscall
SoundConfigTab::rescan<AudioEnumerator>
          (SoundConfigTab *this,AudioEnumerator *enumerator,DeviceGroup *group)

{
  QComboBox *pQVar1;
  QComboBox *pQVar2;
  int iVar3;
  QString current;
  QString local_60;
  QVariant local_48;
  
  pQVar1 = group->mDeviceCombo;
  if (pQVar1 != (QComboBox *)0x0) {
    QObject::blockSignals(SUB81(pQVar1,0));
  }
  QComboBox::currentText();
  iVar3 = QComboBox::currentIndex();
  AudioEnumerator::populate(enumerator,iVar3);
  DeviceGroup::populateDevices<AudioEnumerator>(group,enumerator);
  pQVar2 = group->mDeviceCombo;
  QVariant::QVariant(&local_48,&local_60);
  iVar3 = QComboBox::findData(pQVar2,&local_48,0,0x10);
  QVariant::~QVariant(&local_48);
  if (iVar3 == -1) {
    ConfigTab::setDirty<(Config::Category)1>(&this->super_ConfigTab);
  }
  QComboBox::setCurrentIndex((int)group->mDeviceCombo);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
    }
  }
  if (pQVar1 != (QComboBox *)0x0) {
    QObject::blockSignals(SUB81(pQVar1,0));
  }
  return;
}

Assistant:

void SoundConfigTab::rescan(Enumerator &enumerator, DeviceGroup *group) {
    QSignalBlocker blocker(group->mDeviceCombo);

    // save the current selection
    auto const current = group->mDeviceCombo->currentText();

    // rescan the device list and update the combo
    enumerator.populate(group->mApiCombo->currentIndex());
    group->populateDevices(enumerator);

    // search for the current in the new list, defaulting to 0 if not found
    auto index = group->mDeviceCombo->findText(current);
    if (index == -1) {
        // not found, select the first
        index = 0;
        setDirtyFromEnumerator<Enumerator>();
    }
    group->mDeviceCombo->setCurrentIndex(index);
}